

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

uint32 reindex(dtree_node_t *node,uint32 *next_id)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 *next_id_local;
  dtree_node_t *node_local;
  
  uVar1 = *next_id;
  *next_id = uVar1 + 1;
  node->node_id = uVar1;
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    node_local._4_4_ = 1;
  }
  else {
    uVar1 = reindex(node->y,next_id);
    uVar2 = reindex(node->n,next_id);
    node_local._4_4_ = uVar1 + uVar2 + 1;
  }
  return node_local._4_4_;
}

Assistant:

uint32
reindex(dtree_node_t *node,
	uint32 *next_id)
{
    node->node_id = (*next_id)++;

    if (!IS_LEAF(node)) {
	return reindex(node->y, next_id) +
	    reindex(node->n, next_id) + 1;
    }
    else {
	return 1;
    }
}